

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTarget::AddLinkLibrary(cmTarget *this,cmMakefile *mf,string *lib,cmTargetLinkLibraryType llt)

{
  int iVar1;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var2;
  __type _Var3;
  PolicyStatus PVar4;
  cmTarget *pcVar5;
  size_type sVar6;
  cmValue cVar7;
  allocator<char> local_dd;
  cmTargetLinkLibraryType llt_local;
  string dependencies;
  string targetEntry;
  undefined1 local_88 [16];
  _Optional_payload_base<cmListFileBacktrace> local_78;
  string libName;
  
  llt_local = llt;
  pcVar5 = cmMakefile::FindTargetToUse(mf,lib,false);
  if (((pcVar5 == (cmTarget *)0x0) || (llt == GENERAL_LibraryType)) ||
     (((pcVar5->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsImportedTarget != false))
  {
    std::__cxx11::string::string((string *)&libName,(string *)lib);
  }
  else {
    std::operator+(&dependencies,"$<TARGET_NAME:",lib);
    std::operator+(&libName,&dependencies,">");
    std::__cxx11::string::~string((string *)&dependencies);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dependencies,"LINK_LIBRARIES",&local_dd);
  GetDebugGeneratorExpressions(&targetEntry,this,&libName,llt);
  cmMakefile::GetBacktrace((cmMakefile *)local_88);
  local_78._M_payload._M_value.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)local_88._0_8_;
  local_78._M_payload._M_value.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)local_88._8_8_;
  local_88._0_8_ = (_Map_pointer)0x0;
  local_88._8_8_ = 0;
  local_78._M_engaged = true;
  AppendProperty(this,&dependencies,&targetEntry,(optional<cmListFileBacktrace> *)&local_78,false);
  std::_Optional_payload_base<cmListFileBacktrace>::_M_reset(&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
  std::__cxx11::string::~string((string *)&targetEntry);
  std::__cxx11::string::~string((string *)&dependencies);
  std::__cxx11::string::~string((string *)&libName);
  sVar6 = cmGeneratorExpression::Find(lib);
  if (((sVar6 == 0xffffffffffffffff) &&
      (((pcVar5 == (cmTarget *)0x0 ||
        ((iVar1 = ((pcVar5->impl)._M_t.
                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType,
         iVar1 != 4 && (iVar1 != 7)))) &&
       (_Var3 = std::operator==(&((this->impl)._M_t.
                                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                                 Name,lib), !_Var3)))) &&
     (std::
      vector<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>,std::allocator<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>>>
      ::emplace_back<std::__cxx11::string_const&,cmTargetLinkLibraryType&>
                ((vector<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>,std::allocator<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>>>
                  *)&((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                     OriginalLinkLibraries,lib,&llt_local),
     ((this->impl)._M_t.
      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
      super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType - 1 < 3)) {
    PVar4 = GetPolicyStatusCMP0073(this);
    if ((PVar4 != OLD) && (PVar4 = GetPolicyStatusCMP0073(this), PVar4 != WARN)) {
      return;
    }
    _Var2._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    dependencies._M_string_length = *(size_type *)&((_Var2._M_head_impl)->Name)._M_dataplus;
    dependencies._M_dataplus._M_p = *(pointer *)((long)&(_Var2._M_head_impl)->Name + 8);
    libName._M_dataplus._M_p = (pointer)0xc;
    libName._M_string_length = (size_type)anon_var_dwarf_9b6617;
    cmStrCat<>(&targetEntry,(cmAlphaNum *)&dependencies,(cmAlphaNum *)&libName);
    dependencies._M_dataplus._M_p = (pointer)&dependencies.field_2;
    dependencies._M_string_length = 0;
    dependencies.field_2._M_local_buf[0] = '\0';
    cVar7 = cmMakefile::GetDefinition(mf,&targetEntry);
    if (cVar7.Value != (string *)0x0) {
      std::__cxx11::string::append((string *)&dependencies);
    }
    if (llt_local < (OPTIMIZED_LibraryType|DEBUG_LibraryType)) {
      std::__cxx11::string::append((char *)&dependencies);
    }
    std::__cxx11::string::append((char *)&dependencies);
    std::__cxx11::string::append((string *)&dependencies);
    std::__cxx11::string::append((char *)&dependencies);
    cmMakefile::AddCacheDefinition
              (mf,&targetEntry,dependencies._M_dataplus._M_p,"Dependencies for the target",STATIC,
               false);
    std::__cxx11::string::~string((string *)&dependencies);
    std::__cxx11::string::~string((string *)&targetEntry);
  }
  return;
}

Assistant:

void cmTarget::AddLinkLibrary(cmMakefile& mf, std::string const& lib,
                              cmTargetLinkLibraryType llt)
{
  cmTarget* tgt = mf.FindTargetToUse(lib);
  {
    const bool isNonImportedTarget = tgt && !tgt->IsImported();

    const std::string libName =
      (isNonImportedTarget && llt != GENERAL_LibraryType)
      ? targetNameGenex(lib)
      : lib;
    this->AppendProperty("LINK_LIBRARIES",
                         this->GetDebugGeneratorExpressions(libName, llt),
                         mf.GetBacktrace());
  }

  if (cmGeneratorExpression::Find(lib) != std::string::npos ||
      (tgt &&
       (tgt->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
        tgt->GetType() == cmStateEnums::OBJECT_LIBRARY)) ||
      (this->impl->Name == lib)) {
    return;
  }

  this->impl->OriginalLinkLibraries.emplace_back(lib, llt);

  // Add the explicit dependency information for libraries. This is
  // simply a set of libraries separated by ";". There should always
  // be a trailing ";". These library names are not canonical, in that
  // they may be "-framework x", "-ly", "/path/libz.a", etc.
  // We shouldn't remove duplicates here because external libraries
  // may be purposefully duplicated to handle recursive dependencies,
  // and we removing one instance will break the link line. Duplicates
  // will be appropriately eliminated at emit time.
  if (this->impl->TargetType >= cmStateEnums::STATIC_LIBRARY &&
      this->impl->TargetType <= cmStateEnums::MODULE_LIBRARY &&
      (this->GetPolicyStatusCMP0073() == cmPolicies::OLD ||
       this->GetPolicyStatusCMP0073() == cmPolicies::WARN)) {
    std::string targetEntry = cmStrCat(this->impl->Name, "_LIB_DEPENDS");
    std::string dependencies;
    cmValue old_val = mf.GetDefinition(targetEntry);
    if (old_val) {
      dependencies += *old_val;
    }
    switch (llt) {
      case GENERAL_LibraryType:
        dependencies += "general";
        break;
      case DEBUG_LibraryType:
        dependencies += "debug";
        break;
      case OPTIMIZED_LibraryType:
        dependencies += "optimized";
        break;
    }
    dependencies += ";";
    dependencies += lib;
    dependencies += ";";
    mf.AddCacheDefinition(targetEntry, dependencies,
                          "Dependencies for the target", cmStateEnums::STATIC);
  }
}